

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

int nettlp_create_udp_socket
              (in_addr remote_addr,uint16_t remote_port,in_addr param_3,uint16_t param_4)

{
  int __fd;
  int iVar1;
  int iVar2;
  sockaddr local_38;
  
  __fd = socket(2,2,0x11);
  iVar1 = __fd;
  if (-1 < __fd) {
    local_38.sa_data[6] = '\0';
    local_38.sa_data[7] = '\0';
    local_38.sa_data[8] = '\0';
    local_38.sa_data[9] = '\0';
    local_38.sa_data[10] = '\0';
    local_38.sa_data[0xb] = '\0';
    local_38.sa_data[0xc] = '\0';
    local_38.sa_data[0xd] = '\0';
    local_38.sa_family = 2;
    local_38.sa_data._0_2_ = param_4 << 8 | param_4 >> 8;
    local_38.sa_data._2_4_ = param_3.s_addr;
    iVar1 = bind(__fd,&local_38,0x10);
    if (-1 < iVar1) {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_family = 2;
      local_38.sa_data._0_2_ = remote_port << 8 | remote_port >> 8;
      local_38.sa_data._2_4_ = remote_addr.s_addr;
      iVar2 = connect(__fd,&local_38,0x10);
      iVar1 = __fd;
      if (iVar2 < 0) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

static int nettlp_create_udp_socket(struct in_addr remote_addr,
				    uint16_t remote_port,
				    struct in_addr local_addr,
				    uint16_t local_port)
{
	int fd, ret;
	struct sockaddr_in saddr;

	fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (fd < 0)
		return fd;

	/* bind to local address */
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = local_addr;
	saddr.sin_port = htons(local_port);
	ret = bind(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;
	
	/* connect to remote address */
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = remote_addr;
	saddr.sin_port = htons(remote_port);
	ret = connect(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;

	return fd;
}